

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O0

void removeDirectory(string *path)

{
  int iVar1;
  int iVar2;
  dir_block *pdVar3;
  char *__s2;
  ostream *this;
  string *local_dd8;
  string *local_d60;
  dir_entry *temp;
  int i;
  dir_block *parent;
  int local_d1c;
  string local_d18 [4];
  int parentid;
  int local_cf4;
  string local_cf0 [4];
  int id;
  int local_cd0;
  int legal_layers;
  string local_cc0 [36];
  int local_c9c;
  string local_c98 [4];
  int layers;
  string asStack_18 [8];
  string *local_10;
  string *path_local;
  
  local_d60 = local_c98;
  local_10 = path;
  do {
    std::__cxx11::string::string(local_d60);
    local_d60 = local_d60 + 0x20;
  } while (local_d60 != asStack_18);
  std::__cxx11::string::string(local_cc0,(string *)path);
  iVar1 = parsePath((string *)local_cc0,(string *)local_c98);
  std::__cxx11::string::~string(local_cc0);
  local_c9c = iVar1;
  std::__cxx11::string::string(local_cf0,(string *)path);
  iVar2 = getPathType((string *)local_cf0);
  iVar2 = doesExist((string *)local_c98,iVar1,iVar2 == 2);
  std::__cxx11::string::~string(local_cf0);
  iVar1 = local_c9c;
  local_cd0 = iVar2;
  if (iVar2 == local_c9c) {
    std::__cxx11::string::string(local_d18,(string *)path);
    iVar2 = getPathType((string *)local_d18);
    iVar1 = getId((string *)local_c98,iVar1,iVar2 == 2);
    std::__cxx11::string::~string(local_d18);
    iVar2 = local_c9c + -1;
    local_cf4 = iVar1;
    std::__cxx11::string::string((string *)&parent,(string *)path);
    iVar1 = getPathType((string *)&parent);
    iVar1 = getId((string *)local_c98,iVar2,iVar1 == 2);
    std::__cxx11::string::~string((string *)&parent);
    local_d1c = iVar1;
    delDirOrFile(local_cf4,iVar1);
    pdVar3 = getAddressByLocation_Folder(inodes[local_d1c].i_blocks[0]);
    for (temp._4_4_ = 0; temp._4_4_ < 0x10; temp._4_4_ = temp._4_4_ + 1) {
      __s2 = (char *)std::__cxx11::string::c_str();
      iVar1 = strcmp(pdVar3->dirs[temp._4_4_].name,__s2);
      if (iVar1 == 0) {
        memset(pdVar3->dirs + temp._4_4_,0,0x100);
        break;
      }
    }
  }
  else {
    setColor(3);
    this = std::operator<<((ostream *)&std::cout,"Path is illegal");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    setColor(2);
  }
  local_dd8 = asStack_18;
  do {
    local_dd8 = local_dd8 + -0x20;
    std::__cxx11::string::~string(local_dd8);
  } while (local_dd8 != local_c98);
  return;
}

Assistant:

void removeDirectory(string path) {
    string names[100];
    int layers = parsePath(path, names);
    int legal_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (legal_layers == layers) {
        int id = getId(names, layers, getPathType(path) == RELATIVE_PATH);
        int parentid = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);
        delDirOrFile(id, parentid);
        dir_block *parent = getAddressByLocation_Folder(inodes[parentid].i_blocks[0]);
        for (int i = 0; i < 16; i++) {
            if (strcmp(parent->dirs[i].name, names[layers - 1].c_str()) == 0) {
                dir_entry *temp = &parent->dirs[i];
                memset(temp, '\0', sizeof(dir_entry));
                break;
            }
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << "Path is illegal" << endl;
        setColor(COLOR_ORIGIN);
    }
}